

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

bool __thiscall
SslTcpServerImpl::AddCertificate
          (SslTcpServerImpl *this,char *szCAcertificate,char *szHostCertificate,char *szHostKey)

{
  pointer pSVar1;
  int __val;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d0;
  wstring local_b0;
  SslServerContext local_90;
  
  OpenSSLWrapper::SslServerContext::SslServerContext(&local_90);
  std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>::
  emplace_back<OpenSSLWrapper::SslServerContext>(&this->m_SslCtx,&local_90);
  OpenSSLWrapper::SslServerContext::~SslServerContext(&local_90);
  __val = OpenSSLWrapper::SslServerContext::SetCertificates
                    ((this->m_SslCtx).
                     super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1,szCAcertificate,
                     szHostCertificate,szHostKey);
  if (__val == 1) {
    OpenSSLWrapper::SslServerContext::AddVirtualHost
              ((this->m_SslCtx).
               super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,&this->m_SslCtx);
  }
  else {
    std::__cxx11::to_wstring(&local_b0,__val);
    std::operator+(&local_d0,L"Certificate could not be loaded, error: ",&local_b0);
    std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &local_90,&local_d0,L"\r\n");
    OutputDebugString((wchar_t *)local_90.super_SslContext._vptr_SslContext);
    std::__cxx11::wstring::~wstring((wstring *)&local_90);
    std::__cxx11::wstring::~wstring((wstring *)&local_d0);
    std::__cxx11::wstring::~wstring((wstring *)&local_b0);
    pSVar1 = (this->m_SslCtx).
             super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->m_SslCtx).
    super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar1 + -1;
    (**pSVar1[-1].super_SslContext._vptr_SslContext)();
  }
  return __val == 1;
}

Assistant:

bool SslTcpServerImpl::AddCertificate(const char* const szCAcertificate, const char* const szHostCertificate, const char* const szHostKey)
{
    m_SslCtx.emplace_back(SslServerContext());
    const int iRet = m_SslCtx.back().SetCertificates(szCAcertificate, szHostCertificate, szHostKey);
    if (iRet != 1)
    {
        OutputDebugString(wstring(L"Certificate could not be loaded, error: " + to_wstring(iRet) + L"\r\n").c_str());
        m_SslCtx.pop_back();
        return false;
    }
    m_SslCtx.back().AddVirtualHost(&m_SslCtx);
    return true;
}